

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

bool xmrig::Buffer::fromHex(uint8_t *in,size_t size,uint8_t *out)

{
  ulong uVar1;
  uint8_t uVar2;
  byte bVar3;
  ulong in_RAX;
  ulong uVar4;
  bool error;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  uVar1 = 0;
  do {
    uVar4 = uVar1;
    if (size <= uVar4) break;
    uVar2 = hf_hex2bin(in[uVar4],(bool *)((long)&uStack_38 + 7));
    bVar3 = hf_hex2bin(in[uVar4 + 1],(bool *)((long)&uStack_38 + 7));
    out[uVar4 >> 1] = bVar3 | uVar2 << 4;
    uVar1 = uVar4 + 2;
  } while (uStack_38._7_1_ != '\x01');
  return size <= uVar4;
}

Assistant:

bool xmrig::Buffer::fromHex(const uint8_t *in, size_t size, uint8_t *out)
{
    bool error = false;
    for (size_t i = 0; i < size; i += 2) {
        out[i / 2] = static_cast<uint8_t>((hf_hex2bin(in[i], error) << 4) | hf_hex2bin(in[i + 1], error));

        if (error) {
            return false;
        }
    }

    return true;
}